

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

int __thiscall
cmake::Build(cmake *this,int jobs,string *dir,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *targets,string *config,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *nativeOptions,bool clean,bool verbose)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmState *pcVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  cmGlobalGenerator *gg;
  ostream *poVar9;
  string projName;
  string local_898;
  uint local_874;
  string *local_870;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_868;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_860;
  string local_858;
  string cachePath;
  string output;
  
  paVar1 = &output.field_2;
  local_874 = jobs;
  output._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&output,"");
  SetHomeDirectory(this,&output);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)output._M_dataplus._M_p != paVar1) {
    operator_delete(output._M_dataplus._M_p,
                    CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                             output.field_2._M_local_buf[0]) + 1);
  }
  output._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&output,"");
  SetHomeOutputDirectory(this,&output);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)output._M_dataplus._M_p != paVar1) {
    operator_delete(output._M_dataplus._M_p,
                    CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                             output.field_2._M_local_buf[0]) + 1);
  }
  bVar4 = cmsys::SystemTools::FileIsDirectory(dir);
  if (!bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error: ",7);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(dir->_M_dataplus)._M_p,dir->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," is not a directory\n",0x14);
    return 1;
  }
  local_868 = targets;
  local_860 = nativeOptions;
  FindCacheFile(&cachePath,dir);
  bVar4 = LoadCache(this,&cachePath);
  if (bVar4) {
    pcVar2 = this->State;
    output._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&output,"CMAKE_GENERATOR","");
    pcVar7 = cmState::GetCacheEntryValue(pcVar2,&output);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)output._M_dataplus._M_p != paVar1) {
      operator_delete(output._M_dataplus._M_p,
                      CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                               output.field_2._M_local_buf[0]) + 1);
    }
    if (pcVar7 == (char *)0x0) {
      iVar6 = 1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error: could not find CMAKE_GENERATOR in Cache\n",0x2f);
    }
    else {
      output._M_dataplus._M_p = (pointer)paVar1;
      sVar8 = strlen(pcVar7);
      std::__cxx11::string::_M_construct<char_const*>((string *)&output,pcVar7,pcVar7 + sVar8);
      gg = CreateGlobalGenerator(this,&output);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)output._M_dataplus._M_p != paVar1) {
        operator_delete(output._M_dataplus._M_p,
                        CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                                 output.field_2._M_local_buf[0]) + 1);
      }
      if (gg == (cmGlobalGenerator *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error: could create CMAKE_GENERATOR \"",0x25);
        sVar8 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,sVar8);
        iVar6 = 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\"\n",2);
      }
      else {
        SetGlobalGenerator(this,gg);
        pcVar2 = this->State;
        output._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&output,"CMAKE_GENERATOR_INSTANCE","");
        pcVar7 = cmState::GetCacheEntryValue(pcVar2,&output);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)output._M_dataplus._M_p != paVar1) {
          operator_delete(output._M_dataplus._M_p,
                          CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                                   output.field_2._M_local_buf[0]) + 1);
        }
        local_870 = config;
        if (pcVar7 != (char *)0x0) {
          projName.field_2._M_allocated_capacity = (this->CurrentSnapshot).Position.Position;
          projName._M_dataplus._M_p = (pointer)(this->CurrentSnapshot).State;
          projName._M_string_length = (size_type)(this->CurrentSnapshot).Position.Tree;
          cmMakefile::cmMakefile((cmMakefile *)&output,gg,(cmStateSnapshot *)&projName);
          projName._M_dataplus._M_p = (pointer)&projName.field_2;
          sVar8 = strlen(pcVar7);
          std::__cxx11::string::_M_construct<char_const*>((string *)&projName,pcVar7,pcVar7 + sVar8)
          ;
          iVar5 = (*gg->_vptr_cmGlobalGenerator[8])(gg,&projName,&output);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)projName._M_dataplus._M_p != &projName.field_2) {
            operator_delete(projName._M_dataplus._M_p,projName.field_2._M_allocated_capacity + 1);
          }
          cmMakefile::~cmMakefile((cmMakefile *)&output);
          iVar6 = 1;
          if ((char)iVar5 == '\0') goto LAB_00282bf0;
        }
        pcVar2 = this->State;
        output._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&output,"CMAKE_GENERATOR_PLATFORM","");
        pcVar7 = cmState::GetCacheEntryValue(pcVar2,&output);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)output._M_dataplus._M_p != paVar1) {
          operator_delete(output._M_dataplus._M_p,
                          CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                                   output.field_2._M_local_buf[0]) + 1);
        }
        if (pcVar7 != (char *)0x0) {
          projName.field_2._M_allocated_capacity = (this->CurrentSnapshot).Position.Position;
          projName._M_dataplus._M_p = (pointer)(this->CurrentSnapshot).State;
          projName._M_string_length = (size_type)(this->CurrentSnapshot).Position.Tree;
          cmMakefile::cmMakefile((cmMakefile *)&output,gg,(cmStateSnapshot *)&projName);
          projName._M_dataplus._M_p = (pointer)&projName.field_2;
          sVar8 = strlen(pcVar7);
          std::__cxx11::string::_M_construct<char_const*>((string *)&projName,pcVar7,pcVar7 + sVar8)
          ;
          iVar5 = (*gg->_vptr_cmGlobalGenerator[9])(gg,&projName,&output);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)projName._M_dataplus._M_p != &projName.field_2) {
            operator_delete(projName._M_dataplus._M_p,projName.field_2._M_allocated_capacity + 1);
          }
          cmMakefile::~cmMakefile((cmMakefile *)&output);
          iVar6 = 1;
          if ((char)iVar5 == '\0') goto LAB_00282bf0;
        }
        output._M_string_length = 0;
        output.field_2._M_local_buf[0] = '\0';
        projName._M_dataplus._M_p = (pointer)&projName.field_2;
        projName._M_string_length = 0;
        projName.field_2._M_allocated_capacity =
             projName.field_2._M_allocated_capacity & 0xffffffffffffff00;
        pcVar2 = this->State;
        local_898._M_dataplus._M_p = (pointer)&local_898.field_2;
        output._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_898,"CMAKE_PROJECT_NAME","");
        pcVar7 = cmState::GetCacheEntryValue(pcVar2,&local_898);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_898._M_dataplus._M_p != &local_898.field_2) {
          operator_delete(local_898._M_dataplus._M_p,local_898.field_2._M_allocated_capacity + 1);
        }
        sVar3 = projName._M_string_length;
        if (pcVar7 == (char *)0x0) {
          iVar6 = 1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error: could not find CMAKE_PROJECT_NAME in Cache\n",
                     0x32);
        }
        else {
          strlen(pcVar7);
          std::__cxx11::string::_M_replace((ulong)&projName,0,(char *)sVar3,(ulong)pcVar7);
          pcVar2 = this->State;
          local_898._M_dataplus._M_p = (pointer)&local_898.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_898,"CMAKE_VERBOSE_MAKEFILE","");
          pcVar7 = cmState::GetCacheEntryValue(pcVar2,&local_898);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_898._M_dataplus._M_p != &local_898.field_2) {
            operator_delete(local_898._M_dataplus._M_p,local_898.field_2._M_allocated_capacity + 1);
          }
          bVar4 = cmSystemTools::IsOn(pcVar7);
          (*gg->_vptr_cmGlobalGenerator[0x12])(gg,&std::cerr,(ulong)local_874);
          local_898._M_dataplus._M_p = (pointer)&local_898.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_898,"");
          local_858._M_dataplus._M_p = (pointer)&local_858.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_858,"");
          iVar6 = cmGlobalGenerator::Build
                            (gg,local_874,&local_898,dir,&projName,local_868,&output,&local_858,
                             local_870,clean,false,bVar4 || verbose,(cmDuration)0x0,
                             OUTPUT_PASSTHROUGH,local_860);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_858._M_dataplus._M_p != &local_858.field_2) {
            operator_delete(local_858._M_dataplus._M_p,local_858.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_898._M_dataplus._M_p != &local_898.field_2) {
            operator_delete(local_898._M_dataplus._M_p,local_898.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)projName._M_dataplus._M_p != &projName.field_2) {
          operator_delete(projName._M_dataplus._M_p,projName.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)output._M_dataplus._M_p != paVar1) {
          operator_delete(output._M_dataplus._M_p,
                          CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                                   output.field_2._M_local_buf[0]) + 1);
        }
      }
    }
  }
  else {
    iVar6 = 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: could not load cache\n",0x1c);
  }
LAB_00282bf0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cachePath._M_dataplus._M_p != &cachePath.field_2) {
    operator_delete(cachePath._M_dataplus._M_p,cachePath.field_2._M_allocated_capacity + 1);
  }
  return iVar6;
}

Assistant:

int cmake::Build(int jobs, const std::string& dir,
                 const std::vector<std::string>& targets,
                 const std::string& config,
                 const std::vector<std::string>& nativeOptions, bool clean,
                 bool verbose)
{

  this->SetHomeDirectory("");
  this->SetHomeOutputDirectory("");
  if (!cmSystemTools::FileIsDirectory(dir)) {
    std::cerr << "Error: " << dir << " is not a directory\n";
    return 1;
  }

  std::string cachePath = FindCacheFile(dir);
  if (!this->LoadCache(cachePath)) {
    std::cerr << "Error: could not load cache\n";
    return 1;
  }
  const char* cachedGenerator =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR");
  if (!cachedGenerator) {
    std::cerr << "Error: could not find CMAKE_GENERATOR in Cache\n";
    return 1;
  }
  cmGlobalGenerator* gen = this->CreateGlobalGenerator(cachedGenerator);
  if (!gen) {
    std::cerr << "Error: could create CMAKE_GENERATOR \"" << cachedGenerator
              << "\"\n";
    return 1;
  }
  this->SetGlobalGenerator(gen);
  const char* cachedGeneratorInstance =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR_INSTANCE");
  if (cachedGeneratorInstance) {
    cmMakefile mf(gen, this->GetCurrentSnapshot());
    if (!gen->SetGeneratorInstance(cachedGeneratorInstance, &mf)) {
      return 1;
    }
  }
  const char* cachedGeneratorPlatform =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR_PLATFORM");
  if (cachedGeneratorPlatform) {
    cmMakefile mf(gen, this->GetCurrentSnapshot());
    if (!gen->SetGeneratorPlatform(cachedGeneratorPlatform, &mf)) {
      return 1;
    }
  }
  std::string output;
  std::string projName;
  const char* cachedProjectName =
    this->State->GetCacheEntryValue("CMAKE_PROJECT_NAME");
  if (!cachedProjectName) {
    std::cerr << "Error: could not find CMAKE_PROJECT_NAME in Cache\n";
    return 1;
  }
  projName = cachedProjectName;

  const char* cachedVerbose =
    this->State->GetCacheEntryValue("CMAKE_VERBOSE_MAKEFILE");
  if (cmSystemTools::IsOn(cachedVerbose)) {
    verbose = true;
  }

#ifdef CMAKE_HAVE_VS_GENERATORS
  // For VS generators, explicitly check if regeneration is necessary before
  // actually starting the build. If not done separately from the build
  // itself, there is the risk of building an out-of-date solution file due
  // to limitations of the underlying build system.
  std::string const stampList = cachePath + "/" + "CMakeFiles/" +
    cmGlobalVisualStudio9Generator::GetGenerateStampList();

  // Note that the stampList file only exists for VS generators.
  if (cmSystemTools::FileExists(stampList)) {

    // Check if running for Visual Studio 9 - we need to explicitly run
    // the glob verification script before starting the build
    this->AddScriptingCommands();
    if (this->GlobalGenerator->MatchesGeneratorName("Visual Studio 9 2008")) {
      std::string const globVerifyScript =
        cachePath + "/" + "CMakeFiles/" + "VerifyGlobs.cmake";
      if (cmSystemTools::FileExists(globVerifyScript)) {
        std::vector<std::string> args;
        this->ReadListFile(args, globVerifyScript);
      }
    }

    if (!cmakeCheckStampList(stampList)) {
      // Correctly initialize the home (=source) and home output (=binary)
      // directories, which is required for running the generation step.
      std::string homeOrig = this->GetHomeDirectory();
      std::string homeOutputOrig = this->GetHomeOutputDirectory();
      this->SetDirectoriesFromFile(cachePath.c_str());

      this->AddProjectCommands();

      int ret = this->Configure();
      if (ret) {
        cmSystemTools::Message("CMake Configure step failed.  "
                               "Build files cannot be regenerated correctly.");
        return ret;
      }
      ret = this->Generate();
      if (ret) {
        cmSystemTools::Message("CMake Generate step failed.  "
                               "Build files cannot be regenerated correctly.");
        return ret;
      }
      std::string message = "Build files have been written to: ";
      message += this->GetHomeOutputDirectory();
      this->UpdateProgress(message, -1);

      // Restore the previously set directories to their original value.
      this->SetHomeDirectory(homeOrig);
      this->SetHomeOutputDirectory(homeOutputOrig);
    }
  }
#endif

  gen->PrintBuildCommandAdvice(std::cerr, jobs);
  return gen->Build(jobs, "", dir, projName, targets, output, "", config,
                    clean, false, verbose, cmDuration::zero(),
                    cmSystemTools::OUTPUT_PASSTHROUGH, nativeOptions);
}